

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void LowererMD::LegalizeOpnds<false>
               (Instr *instr,LegalForms dstForms,LegalForms src1Forms,LegalForms src2Forms)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  LegalForms LVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x769,"(instr)","instr");
    if (!bVar2) goto LAB_005e4fa2;
    *puVar5 = 0;
  }
  if (((dstForms & LF_Optional) == L_None) &&
     ((instr->m_dst != (Opnd *)0x0) == (dstForms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76a,"(dstForms & LF_Optional || !instr->GetDst() == !dstForms)",
                       "dstForms & LF_Optional || !instr->GetDst() == !dstForms");
    if (!bVar2) goto LAB_005e4fa2;
    *puVar5 = 0;
  }
  if (((src1Forms & LF_Optional) == L_None) &&
     ((instr->m_src1 != (Opnd *)0x0) == (src1Forms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76b,"(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms)",
                       "src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms");
    if (!bVar2) goto LAB_005e4fa2;
    *puVar5 = 0;
  }
  if (((src2Forms & LF_Optional) == L_None) &&
     ((instr->m_src2 != (Opnd *)0x0) == (src2Forms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76c,"(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms)",
                       "src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms");
    if (!bVar2) goto LAB_005e4fa2;
    *puVar5 = 0;
  }
  if (src2Forms != L_None && src1Forms == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76d,"(src1Forms || !src2Forms)","src1Forms || !src2Forms");
    if (!bVar2) {
LAB_005e4fa2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if ((dstForms != L_None) && (instr->m_dst != (Opnd *)0x0)) {
    LegalizeDst<false>(instr,dstForms & L_FormMask | dstForms >> 1 & L_Imm32);
  }
  if ((src1Forms != L_None) && (instr->m_src1 != (Opnd *)0x0)) {
    uVar6 = (ulong)src1Forms;
    if ((instr->m_dst == (Opnd *)0x0) || (bVar2 = IR::Opnd::IsMemoryOpnd(instr->m_dst), !bVar2)) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if ((src1Forms & L_Mem) != L_None) {
        bVar3 = EncoderMD::IsOPEQ(instr);
        uVar6 = (ulong)(src1Forms & ~L_Mem);
        if (bVar3) {
          uVar6 = (ulong)src1Forms;
        }
      }
    }
    LegalizeSrc<false>(instr,instr->m_src1,
                       (LegalForms)uVar6 & L_FormMask | (LegalForms)(uVar6 >> 1) & L_Imm32);
    bVar3 = IR::Opnd::IsMemoryOpnd(instr->m_src1);
    LVar4 = src2Forms;
    if (bVar3) {
      LVar4 = src2Forms ^ L_Mem;
    }
    if (bVar2) {
      LVar4 = src2Forms ^ L_Mem;
    }
    if ((src2Forms & L_Mem) == L_None) {
      LVar4 = src2Forms;
    }
    if ((LVar4 != L_None) && (instr->m_src2 != (Opnd *)0x0)) {
      LegalizeSrc<false>(instr,instr->m_src2,LVar4 & L_FormMask | LVar4 >> 1 & L_Imm32);
      return;
    }
  }
  return;
}

Assistant:

void LowererMD::LegalizeOpnds(IR::Instr *const instr, const LegalForms dstForms, LegalForms src1Forms, LegalForms src2Forms)
{
    Assert(instr);
    Assert(dstForms & LF_Optional || !instr->GetDst() == !dstForms);
    Assert(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms);
    Assert(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms);
    Assert(src1Forms || !src2Forms);

    const auto NormalizeForms = [](LegalForms forms) -> LegalForms
    {
    #ifdef _M_X64
        if(forms & L_Ptr)
        {
            forms |= L_Imm32;
        }
    #else
        if(forms & (L_Imm32 | L_Ptr))
        {
            forms |= L_Imm32 | L_Ptr;
        }
    #endif
        // Remove Legal Flags
        forms &= L_FormMask;
        return forms;
    };

    if(dstForms && instr->GetDst())
    {
        LegalizeDst<verify>(instr, NormalizeForms(dstForms));
    }
    if(!src1Forms || !instr->GetSrc1())
    {
        return;
    }
    bool hasMemOpnd = instr->GetDst() && instr->GetDst()->IsMemoryOpnd();

    // Allow src1 to be a mem opnd if dst & src1 must be the same
    if (hasMemOpnd && src1Forms & L_Mem && !EncoderMD::IsOPEQ(instr))
    {
        src1Forms ^= L_Mem;
    }
    LegalizeSrc<verify>(instr, instr->GetSrc1(), NormalizeForms(src1Forms));

    hasMemOpnd |= instr->GetSrc1()->IsMemoryOpnd();
    // If dst or src1 is a mem opnd, mem2 cannot be a mem opnd
    if(hasMemOpnd && src2Forms & L_Mem)
    {
        src2Forms ^= L_Mem;
    }
    if(src2Forms && instr->GetSrc2())
    {
        LegalizeSrc<verify>(instr, instr->GetSrc2(), NormalizeForms(src2Forms));
    }
}